

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::rust::GenerateOneofAccessors
          (rust *this,Context *ctx,OneofDescriptor *oneof,AccessorCase accessor_case)

{
  long *plVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *value;
  OneofDescriptor *oneof_00;
  OneofDescriptor *oneof_01;
  long lVar3;
  string_view name;
  anon_class_1_0_00000001 local_811;
  undefined1 *local_810;
  undefined8 local_808;
  undefined1 local_800;
  undefined7 uStack_7ff;
  undefined8 uStack_7f8;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined1 local_7e0;
  undefined7 uStack_7df;
  undefined8 uStack_7d8;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [24];
  byte abStack_698 [8];
  string local_690;
  undefined1 local_670 [48];
  string_view local_640;
  string_view local_630;
  Sub local_620;
  Sub local_568;
  Sub local_4b0;
  Sub local_3f8;
  Sub local_340;
  Sub local_288;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [8];
  undefined8 uStack_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  code *local_198;
  undefined1 local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [16];
  undefined1 local_168;
  undefined1 local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0;
  undefined1 local_68;
  size_type local_60;
  pointer local_58;
  
  pcVar2 = (char *)CONCAT44(in_register_0000000c,accessor_case);
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"oneof_name","");
  name._M_str = pcVar2;
  name._M_len = (size_t)ctx->rust_generator_context_->files_in_current_crate_;
  RsSafeName_abi_cxx11_
            (&local_690,(rust *)ctx->rust_generator_context_->import_path_to_crate_name_,name);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_620,&local_730,&local_690);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"view_lifetime","");
  local_630 = ViewLifetime((AccessorCase)oneof);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_568,&local_750,&local_630);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"self","");
  local_640 = ViewReceiver((AccessorCase)oneof);
  value = &local_640;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_4b0,&local_770,value);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"oneof_enum_module","");
  local_670._0_8_ = 7;
  local_670._8_8_ = "crate::";
  RustModuleForContainingType_abi_cxx11_
            (&local_710,this,(Context *)ctx->printer_,(Descriptor *)value);
  local_60 = local_710._M_string_length;
  local_58 = local_710._M_dataplus._M_p;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_6b0,(AlphaNum *)local_670);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_3f8,&local_790,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"view_enum_name","");
  OneofViewEnumRsName_abi_cxx11_((string *)local_6d0,(rust *)ctx,oneof_00);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_340,&local_7b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0);
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"case_enum_name","");
  OneofCaseEnumRsName_abi_cxx11_(&local_6f0,(rust *)ctx,oneof_01);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_288,&local_7d0,&local_6f0);
  local_810 = &local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"view_cases","");
  local_1d0 = local_1c0;
  if (local_810 == &local_800) {
    uStack_1b8 = uStack_7f8;
  }
  else {
    local_1d0 = local_810;
  }
  local_1c8 = local_808;
  local_808 = 0;
  local_800 = 0;
  local_810 = &local_800;
  local_1b0 = (undefined8 *)operator_new(0x18);
  *local_1b0 = ctx;
  local_1b0[1] = this;
  *(undefined1 *)(local_1b0 + 2) = 0;
  local_198 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_1a8 = 0;
  local_1a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_190 = 1;
  local_188 = local_178;
  local_180 = 0;
  local_178[0] = 0;
  local_168 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,0x361ff2);
  local_120 = 0;
  local_7f0 = &local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"oneof_case_body","");
  local_118 = local_108;
  if (local_7f0 == &local_7e0) {
    uStack_100 = uStack_7d8;
  }
  else {
    local_118 = local_7f0;
  }
  local_110 = local_7e8;
  local_7e8 = 0;
  local_7e0 = 0;
  local_7f0 = &local_7e0;
  local_f8 = (undefined8 *)operator_new(0x18);
  *local_f8 = this;
  local_f8[1] = ctx;
  *(undefined1 *)(local_f8 + 2) = 0;
  local_e0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_f0 = 0;
  local_e8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_d8 = 1;
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  local_b0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,0x361ff2);
  local_68 = 0;
  google::protobuf::io::Printer::Emit
            (*(undefined8 *)(this + 0x10),&local_620,8,0x192,
             "\n        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {\n          match $self$.$oneof_name$_case() {\n            $view_cases$\n            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)\n          }\n        }\n\n        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {\n          $oneof_case_body$\n        }\n      "
            );
  lVar3 = 0x5c0;
  do {
    if (*(char *)((long)&local_630._M_str + lVar3) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_670 + lVar3 + 8));
    }
    plVar1 = *(long **)((long)&local_690._M_dataplus._M_p + lVar3);
    if ((long *)(local_670 + lVar3 + -0x10) != plVar1) {
      operator_delete(plVar1,*(long *)(local_670 + lVar3 + -0x10) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[abStack_698[lVar3]]._M_data)
              (&local_811,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_6d0 + lVar3 + 0x18));
    abStack_698[lVar3] = 0xff;
    if ((long *)(local_6d0 + lVar3 + 8) != *(long **)(local_6d0 + lVar3 + -8)) {
      operator_delete(*(long **)(local_6d0 + lVar3 + -8),*(long *)(local_6d0 + lVar3 + 8) + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810,CONCAT71(uStack_7ff,local_800) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6d0._0_8_ != local_6d0 + 0x10) {
    operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6b0._0_8_ != local_6b0 + 0x10) {
    operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateOneofAccessors(Context& ctx, const OneofDescriptor& oneof,
                            AccessorCase accessor_case) {
  ctx.Emit(
      {{"oneof_name", RsSafeName(oneof.name())},
       {"view_lifetime", ViewLifetime(accessor_case)},
       {"self", ViewReceiver(accessor_case)},
       {"oneof_enum_module",
        absl::StrCat("crate::", RustModuleForContainingType(
                                    ctx, oneof.containing_type()))},
       {"view_enum_name", OneofViewEnumRsName(oneof)},
       {"case_enum_name", OneofCaseEnumRsName(oneof)},
       {"view_cases",
        [&] {
          for (int i = 0; i < oneof.field_count(); ++i) {
            auto& field = *oneof.field(i);
            std::string rs_type = RsTypeNameView(ctx, field);
            if (rs_type.empty()) {
              continue;
            }
            std::string field_name = FieldNameWithCollisionAvoidance(field);
            ctx.Emit(
                {
                    {"case", OneofCaseRsName(field)},
                    {"rs_getter", RsSafeName(field_name)},
                    {"type", rs_type},
                },
                R"rs(
                $oneof_enum_module$$case_enum_name$::$case$ =>
                    $oneof_enum_module$$view_enum_name$::$case$(self.$rs_getter$()),
                )rs");
          }
        }},
       {"oneof_case_body",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"case_thunk", ThunkName(ctx, oneof, "case")}},
                     "unsafe { $case_thunk$(self.raw_msg()) }");
          } else {
            ctx.Emit(
                // The field index for an arbitrary field that in the oneof.
                {{"upb_mt_field_index",
                  UpbMiniTableFieldIndex(*oneof.field(0))}},
                R"rs(
                let field_num = unsafe {
                  let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                      <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                      $upb_mt_field_index$);
                  $pbr$::upb_Message_WhichOneofFieldNumber(
                        self.raw_msg(), f)
                };
                unsafe {
                  $oneof_enum_module$$case_enum_name$::try_from(field_num).unwrap_unchecked()
                }
              )rs");
          }
        }}},
      R"rs(
        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {
          match $self$.$oneof_name$_case() {
            $view_cases$
            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)
          }
        }

        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {
          $oneof_case_body$
        }
      )rs");
}